

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t id)

{
  uint32_t *ts;
  int iVar1;
  uint uVar2;
  uint uVar3;
  SPIRType *pSVar4;
  size_type sVar5;
  runtime_error *this_00;
  char (*ts_1) [2];
  uint *ts_1_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1_01;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  char (*ts_2) [2];
  uint *in_R9;
  ulong uVar10;
  uint32_t *ts_00;
  string local_58;
  uint32_t local_34;
  
  iVar1 = *(int *)&(type->super_IVariant).field_0xc;
  local_34 = id;
  if (iVar1 != 0xf && (type->pointer == true && type->storage == StorageClassPhysicalStorageBuffer))
  {
    pSVar4 = Compiler::get_pointee_type(&this->super_Compiler,type);
    ts_2 = (char (*) [2])(this->super_Compiler)._vptr_Compiler;
    ts_1 = (char (*) [2])0x0;
    (**(_func_int **)(ts_2 + 0x4c))(__return_storage_ptr__,this,pSVar4);
    if ((type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
      lVar8 = 0;
      uVar10 = 0;
      do {
        if ((type->array_size_literal).super_VectorView<bool>.ptr[uVar10] == true) {
          join<unsigned_int_const&,char_const(&)[2]>
                    (&local_58,
                     (spirv_cross *)((long)(type->array).super_VectorView<unsigned_int>.ptr + lVar8)
                     ,(uint *)0x2e7de5,ts_1);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
        }
        else {
          ts_1 = (char (*) [2])0x2e7de5;
          join<char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                    (&local_58,(spirv_cross *)0x2f6fbd,
                     (char (*) [3])((long)(type->array).super_VectorView<unsigned_int>.ptr + lVar8),
                     (uint *)0x2e7de5,ts_2);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        uVar10 = uVar10 + 1;
        lVar8 = lVar8 + 4;
      } while (uVar10 < (type->array).super_VectorView<unsigned_int>.buffer_size);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  switch(iVar1) {
  case 8:
    uVar6 = 0x81;
    if ((this->options).es != false) {
      uVar6 = 299;
    }
    if ((this->options).version <= uVar6) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Unsigned integers are not supported on legacy targets.","");
      ::std::runtime_error::runtime_error(this_00,(string *)&local_58);
      *(undefined ***)this_00 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    break;
  case 0xf:
    if ((this->backend).explicit_struct_type != true) {
      (*(this->super_Compiler)._vptr_Compiler[6])
                (__return_storage_ptr__,this,(ulong)(type->super_IVariant).self.id,1);
      return __return_storage_ptr__;
    }
    ts_1_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    (*(this->super_Compiler)._vptr_Compiler[6])
              (&local_58,this,(ulong)(type->super_IVariant).self.id);
    join<char_const(&)[8],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)"struct ",(char (*) [8])&local_58,ts_1_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_58._M_dataplus._M_p);
    return __return_storage_ptr__;
  case 0x10:
  case 0x11:
    (*(this->super_Compiler)._vptr_Compiler[0x17])(__return_storage_ptr__,this,type);
    return __return_storage_ptr__;
  case 0x12:
    sVar5 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_Compiler).comparison_ids._M_h,&local_34);
    pcVar9 = "samplerShadow";
    if (sVar5 == 0) {
      pcVar9 = "sampler";
    }
    pcVar7 = pcVar9 + 0xd;
    if (sVar5 == 0) {
      pcVar7 = pcVar9 + 7;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    goto LAB_001e2e51;
  case 0x13:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "accelerationStructureNV";
    pcVar7 = "";
    goto LAB_001e2e51;
  default:
    if (iVar1 == 1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "void";
      pcVar7 = "";
      goto LAB_001e2e51;
    }
  }
  uVar6 = type->vecsize;
  uVar2 = type->columns;
  if (uVar2 != 1 || uVar6 != 1) {
    ts = &type->vecsize;
    uVar3 = iVar1 - 2;
    if (uVar6 < 2 || uVar2 != 1) {
      if (uVar6 == uVar2) {
        ts_1_00 = &switchD_001e2e82::switchdataD_002dd138;
        switch(uVar3) {
        case 0:
          pcVar7 = "bmat";
          break;
        default:
          goto switchD_001e2d62_default;
        case 5:
          pcVar7 = "imat";
          break;
        case 6:
          pcVar7 = "umat";
          break;
        case 10:
          pcVar7 = "f16mat";
          goto LAB_001e30a0;
        case 0xb:
          pcVar7 = "f16mat";
          goto LAB_001e30d5;
        case 0xc:
          pcVar7 = "dmat";
        }
        goto LAB_001e306b;
      }
      if (uVar3 < 0xd) {
        ts_00 = &type->columns;
        switch(uVar3) {
        case 0:
          pcVar7 = "bmat";
          break;
        default:
          goto switchD_001e2d62_default;
        case 5:
          pcVar7 = "imat";
          break;
        case 6:
          pcVar7 = "umat";
          break;
        case 10:
          join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"f16mat",(char (*) [7])ts_00,
                     (uint *)0x2e2f05,(char (*) [2])ts,in_R9);
          return __return_storage_ptr__;
        case 0xb:
          join<char_const(&)[4],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)0x2e3ce2,(char (*) [4])ts_00,
                     (uint *)0x2e2f05,(char (*) [2])ts,in_R9);
          return __return_storage_ptr__;
        case 0xc:
          pcVar7 = "dmat";
        }
        join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)pcVar7,(char (*) [5])ts_00,(uint *)0x2e2f05
                   ,(char (*) [2])ts,in_R9);
        return __return_storage_ptr__;
      }
switchD_001e2d62_default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "???";
      pcVar7 = "";
      goto LAB_001e2e51;
    }
    ts_1_00 = &switchD_001e2db7::switchdataD_002dd16c;
    switch(uVar3) {
    case 0:
      pcVar7 = "bvec";
      goto LAB_001e306b;
    case 1:
      pcVar7 = "i8vec";
      goto LAB_001e2ff7;
    case 2:
      pcVar7 = "u8vec";
LAB_001e2ff7:
      join<char_const(&)[6],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)pcVar7,(char (*) [6])ts,
                 &switchD_001e2db7::switchdataD_002dd16c);
      return __return_storage_ptr__;
    case 3:
      pcVar7 = "i16vec";
      break;
    case 4:
      pcVar7 = "u16vec";
      break;
    case 5:
      pcVar7 = "ivec";
      goto LAB_001e306b;
    case 6:
      pcVar7 = "uvec";
      goto LAB_001e306b;
    case 7:
      pcVar7 = "i64vec";
      break;
    case 8:
      pcVar7 = "u64vec";
      break;
    default:
      goto switchD_001e2d62_default;
    case 10:
      pcVar7 = "f16vec";
      break;
    case 0xb:
      pcVar7 = "i64vec";
LAB_001e30d5:
      join<char_const(&)[4],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)(pcVar7 + 3),(char (*) [4])ts,ts_1_00);
      return __return_storage_ptr__;
    case 0xc:
      pcVar7 = "dvec";
LAB_001e306b:
      join<char_const(&)[5],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)pcVar7,(char (*) [5])ts,ts_1_00);
      return __return_storage_ptr__;
    }
LAB_001e30a0:
    join<char_const(&)[7],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)pcVar7,(char (*) [7])ts,ts_1_00);
    return __return_storage_ptr__;
  }
  switch(iVar1) {
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "bool";
    pcVar7 = "";
    break;
  case 3:
    pcVar7 = (this->backend).basic_int8_type;
    goto LAB_001e2f82;
  case 4:
    pcVar7 = (this->backend).basic_uint8_type;
    goto LAB_001e2f82;
  case 5:
    pcVar7 = (this->backend).basic_int16_type;
    goto LAB_001e2f82;
  case 6:
    pcVar7 = (this->backend).basic_uint16_type;
    goto LAB_001e2f82;
  case 7:
    pcVar7 = (this->backend).basic_int_type;
    goto LAB_001e2f82;
  case 8:
    pcVar7 = (this->backend).basic_uint_type;
LAB_001e2f82:
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,(allocator *)&local_58);
    return __return_storage_ptr__;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "int64_t";
    pcVar7 = "";
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "uint64_t";
    pcVar7 = "";
    break;
  case 0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "atomic_uint";
    pcVar7 = "";
    break;
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "float16_t";
    pcVar7 = "";
    break;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "float";
    pcVar7 = "";
    break;
  case 0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "double";
    pcVar7 = "";
    break;
  default:
    goto switchD_001e2d62_default;
  }
LAB_001e2e51:
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::type_to_glsl(const SPIRType &type, uint32_t id)
{
	if (type.pointer && type.storage == StorageClassPhysicalStorageBufferEXT && type.basetype != SPIRType::Struct)
	{
		// Need to create a magic type name which compacts the entire type information.
		string name = type_to_glsl(get_pointee_type(type));
		for (size_t i = 0; i < type.array.size(); i++)
		{
			if (type.array_size_literal[i])
				name += join(type.array[i], "_");
			else
				name += join("id", type.array[i], "_");
		}
		name += "Pointer";
		return name;
	}

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		if (backend.explicit_struct_type)
			return join("struct ", to_name(type.self));
		else
			return to_name(type.self);

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_glsl(type, id);

	case SPIRType::Sampler:
		// The depth field is set by calling code based on the variable ID of the sampler, effectively reintroducing
		// this distinction into the type system.
		return comparison_ids.count(id) ? "samplerShadow" : "sampler";

	case SPIRType::AccelerationStructure:
		return "accelerationStructureNV";

	case SPIRType::Void:
		return "void";

	default:
		break;
	}

	if (type.basetype == SPIRType::UInt && is_legacy())
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	if (type.vecsize == 1 && type.columns == 1) // Scalar builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return "bool";
		case SPIRType::SByte:
			return backend.basic_int8_type;
		case SPIRType::UByte:
			return backend.basic_uint8_type;
		case SPIRType::Short:
			return backend.basic_int16_type;
		case SPIRType::UShort:
			return backend.basic_uint16_type;
		case SPIRType::Int:
			return backend.basic_int_type;
		case SPIRType::UInt:
			return backend.basic_uint_type;
		case SPIRType::AtomicCounter:
			return "atomic_uint";
		case SPIRType::Half:
			return "float16_t";
		case SPIRType::Float:
			return "float";
		case SPIRType::Double:
			return "double";
		case SPIRType::Int64:
			return "int64_t";
		case SPIRType::UInt64:
			return "uint64_t";
		default:
			return "???";
		}
	}
	else if (type.vecsize > 1 && type.columns == 1) // Vector builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bvec", type.vecsize);
		case SPIRType::SByte:
			return join("i8vec", type.vecsize);
		case SPIRType::UByte:
			return join("u8vec", type.vecsize);
		case SPIRType::Short:
			return join("i16vec", type.vecsize);
		case SPIRType::UShort:
			return join("u16vec", type.vecsize);
		case SPIRType::Int:
			return join("ivec", type.vecsize);
		case SPIRType::UInt:
			return join("uvec", type.vecsize);
		case SPIRType::Half:
			return join("f16vec", type.vecsize);
		case SPIRType::Float:
			return join("vec", type.vecsize);
		case SPIRType::Double:
			return join("dvec", type.vecsize);
		case SPIRType::Int64:
			return join("i64vec", type.vecsize);
		case SPIRType::UInt64:
			return join("u64vec", type.vecsize);
		default:
			return "???";
		}
	}
	else if (type.vecsize == type.columns) // Simple Matrix builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bmat", type.vecsize);
		case SPIRType::Int:
			return join("imat", type.vecsize);
		case SPIRType::UInt:
			return join("umat", type.vecsize);
		case SPIRType::Half:
			return join("f16mat", type.vecsize);
		case SPIRType::Float:
			return join("mat", type.vecsize);
		case SPIRType::Double:
			return join("dmat", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
	else
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bmat", type.columns, "x", type.vecsize);
		case SPIRType::Int:
			return join("imat", type.columns, "x", type.vecsize);
		case SPIRType::UInt:
			return join("umat", type.columns, "x", type.vecsize);
		case SPIRType::Half:
			return join("f16mat", type.columns, "x", type.vecsize);
		case SPIRType::Float:
			return join("mat", type.columns, "x", type.vecsize);
		case SPIRType::Double:
			return join("dmat", type.columns, "x", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
}